

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<long>::Reserve(RepeatedField<long> *this,int new_size)

{
  int size;
  ulong uVar1;
  unsigned_long uVar2;
  LogMessage *pLVar3;
  long *plVar4;
  Rep *local_b0;
  long *limit;
  long *e;
  int old_total_size;
  size_t bytes;
  byte local_69;
  LogMessage local_68;
  Arena *local_30;
  Arena *arena;
  Rep *new_rep;
  Rep *old_rep;
  RepeatedField<long> *pRStack_10;
  int new_size_local;
  RepeatedField<long> *this_local;
  
  if (this->total_size_ < new_size) {
    old_rep._4_4_ = new_size;
    pRStack_10 = this;
    if (this->total_size_ < 1) {
      local_b0 = (Rep *)0x0;
    }
    else {
      local_b0 = rep(this);
    }
    new_rep = local_b0;
    local_30 = GetArena(this);
    old_rep._4_4_ = internal::CalculateReserveSize(this->total_size_,old_rep._4_4_);
    uVar1 = (ulong)old_rep._4_4_;
    uVar2 = std::numeric_limits<unsigned_long>::max();
    local_69 = 0;
    if (uVar2 - 8 >> 3 < uVar1) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x393);
      local_69 = 1;
      pLVar3 = internal::LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (static_cast<size_t>(new_size)) <= ((std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element)): "
                         );
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,"Requested size is too large to fit into size_t.");
      internal::LogFinisher::operator=((LogFinisher *)((long)&bytes + 3),pLVar3);
    }
    if ((local_69 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_68);
    }
    uVar1 = (long)old_rep._4_4_ * 8 + 8;
    if (local_30 == (Arena *)0x0) {
      arena = (Arena *)operator_new(uVar1);
    }
    else {
      arena = (Arena *)Arena::CreateArray<char>(local_30,uVar1);
    }
    *(Arena **)arena = local_30;
    size = this->total_size_;
    this->total_size_ = old_rep._4_4_;
    this->arena_or_elements_ = arena + 8;
    limit = elements(this);
    plVar4 = limit + this->total_size_;
    for (; limit < plVar4; limit = limit + 1) {
    }
    if (0 < this->current_size_) {
      plVar4 = elements(this);
      MoveArray(this,plVar4,new_rep->elements,this->current_size_);
    }
    InternalDeallocate(this,new_rep,size);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  if (total_size_ >= new_size) return;
  Rep* old_rep = total_size_ > 0 ? rep() : nullptr;
  Rep* new_rep;
  Arena* arena = GetArena();
  new_size = internal::CalculateReserveSize(total_size_, new_size);
  GOOGLE_DCHECK_LE(
      static_cast<size_t>(new_size),
      (std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == nullptr) {
    new_rep = static_cast<Rep*>(::operator new(bytes));
  } else {
    new_rep = reinterpret_cast<Rep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;
  int old_total_size = total_size_;
  // Already known: new_size >= internal::kMinRepeatedFieldAllocationSize
  // Maintain invariant:
  //     total_size_ == 0 ||
  //     total_size_ >= internal::kMinRepeatedFieldAllocationSize
  total_size_ = new_size;
  arena_or_elements_ = new_rep->elements;
  // Invoke placement-new on newly allocated elements. We shouldn't have to do
  // this, since Element is supposed to be POD, but a previous version of this
  // code allocated storage with "new Element[size]" and some code uses
  // RepeatedField with non-POD types, relying on constructor invocation. If
  // Element has a trivial constructor (e.g., int32_t), gcc (tested with -O2)
  // completely removes this loop because the loop body is empty, so this has no
  // effect unless its side-effects are required for correctness.
  // Note that we do this before MoveArray() below because Element's copy
  // assignment implementation will want an initialized instance first.
  Element* e = &elements()[0];
  Element* limit = e + total_size_;
  for (; e < limit; e++) {
    new (e) Element;
  }
  if (current_size_ > 0) {
    MoveArray(&elements()[0], old_rep->elements, current_size_);
  }

  // Likewise, we need to invoke destructors on the old array.
  InternalDeallocate(old_rep, old_total_size);

}